

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O0

void __thiscall
cmGlobVerificationManager::CacheEntryKey::PrintGlobCommand
          (CacheEntryKey *this,ostream *out,string *cmdVar)

{
  ostream *poVar1;
  ulong uVar2;
  char *pcVar3;
  string *cmdVar_local;
  ostream *out_local;
  CacheEntryKey *this_local;
  
  poVar1 = std::operator<<(out,"file(GLOB");
  pcVar3 = " ";
  if ((this->Recurse & 1U) != 0) {
    pcVar3 = "_RECURSE ";
  }
  std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(out,(string *)cmdVar);
  std::operator<<(poVar1," ");
  if (((this->Recurse & 1U) != 0) && ((this->FollowSymlinks & 1U) != 0)) {
    std::operator<<(out,"FOLLOW_SYMLINKS ");
  }
  poVar1 = std::operator<<(out,"LIST_DIRECTORIES ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(this->ListDirectories & 1));
  std::operator<<(poVar1," ");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar1 = std::operator<<(out,"RELATIVE \"");
    poVar1 = std::operator<<(poVar1,(string *)&this->Relative);
    std::operator<<(poVar1,"\" ");
  }
  poVar1 = std::operator<<(out,"\"");
  poVar1 = std::operator<<(poVar1,(string *)&this->Expression);
  std::operator<<(poVar1,"\")");
  return;
}

Assistant:

void cmGlobVerificationManager::CacheEntryKey::PrintGlobCommand(
  std::ostream& out, const std::string& cmdVar)
{
  out << "file(GLOB" << (this->Recurse ? "_RECURSE " : " ");
  out << cmdVar << " ";
  if (this->Recurse && this->FollowSymlinks) {
    out << "FOLLOW_SYMLINKS ";
  }
  out << "LIST_DIRECTORIES " << this->ListDirectories << " ";
  if (!this->Relative.empty()) {
    out << "RELATIVE \"" << this->Relative << "\" ";
  }
  out << "\"" << this->Expression << "\")";
}